

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

DnsNameEntry * __thiscall DnsNameEntry::CreateCopy(DnsNameEntry *this)

{
  size_t sVar1;
  size_t sVar2;
  DnsNameEntry *this_00;
  uint8_t *__dest;
  
  this_00 = (DnsNameEntry *)operator_new(0x50);
  DnsNameEntry(this_00);
  sVar1 = this->name_len;
  this_00->name_len = sVar1;
  if (sVar1 != 0) {
    if (this_00->name != (uint8_t *)0x0) {
      operator_delete__(this_00->name);
    }
    sVar2 = this->name_len;
    __dest = (uint8_t *)operator_new__(sVar2 + 1);
    this_00->name = __dest;
    memcpy(__dest,this->name,sVar2);
    __dest[sVar2] = '\0';
    this_00->count = this->count;
    this_00->is_nx = this->is_nx;
    this_00->leakType = this->leakType;
    sVar2 = this->addr_len;
    memcpy(this_00->addr,this->addr,sVar2);
    this_00->addr_len = sVar2;
    this_00->rr_type = this->rr_type;
    this_00->flags = this->flags;
  }
  return this_00;
}

Assistant:

DnsNameEntry* DnsNameEntry::CreateCopy()
{
    DnsNameEntry* key = new DnsNameEntry();

    if (key != NULL)
    {
        key->name_len = name_len;
        if (name_len > 0) {
            if (key->name != NULL) {
                delete[] key->name;
            }

            key->name = new uint8_t[(size_t)name_len + 1];

            if (key->name == NULL) {
                delete key;
                key = NULL;
            }
            else {
                memcpy(key->name, name, name_len);
                key->name[name_len] = 0;
                key->count = count;
                key->is_nx = is_nx;
                key->leakType = leakType;
                memcpy(key->addr, addr, addr_len);
                key->addr_len = addr_len;
                key->rr_type = rr_type;
                key->flags = flags;
            }
        }
    }

    return key;
}